

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

gint uc_exits_cmp(gconstpointer a,gconstpointer b,gpointer user_data)

{
  uint64_t rhs;
  uint64_t lhs;
  gpointer user_data_local;
  gconstpointer b_local;
  gconstpointer a_local;
  
  if (*a < *b) {
    a_local._4_4_ = -1;
  }
  else if (*a == *b) {
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static gint uc_exits_cmp(gconstpointer a, gconstpointer b, gpointer user_data)
{
    uint64_t lhs = *((uint64_t *)a);
    uint64_t rhs = *((uint64_t *)b);

    if (lhs < rhs) {
        return -1;
    } else if (lhs == rhs) {
        return 0;
    } else {
        return 1;
    }
}